

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O3

XrResult GenValidUsageNextXrCreateWorldMeshDetectorML
                   (XrSession session,XrWorldMeshDetectorCreateInfoML *createInfo,
                   XrWorldMeshDetectorML *detector)

{
  XrResult XVar1;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar2;
  __uniq_ptr_impl<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>
  local_30;
  
  pVar2 = HandleInfo<XrSession_T_*>::getWithInstanceInfo(&g_session_info,session);
  XVar1 = (*(pVar2.second)->dispatch_table->CreateWorldMeshDetectorML)(session,createInfo,detector);
  if ((detector != (XrWorldMeshDetectorML *)0x0) && (XVar1 == XR_SUCCESS)) {
    local_30._M_t.
    super__Tuple_impl<0UL,_GenValidUsageXrHandleInfo_*,_std::default_delete<GenValidUsageXrHandleInfo>_>
    .super__Head_base<0UL,_GenValidUsageXrHandleInfo_*,_false>._M_head_impl =
         (tuple<GenValidUsageXrHandleInfo_*,_std::default_delete<GenValidUsageXrHandleInfo>_>)
         operator_new(0x18);
    *(long *)local_30._M_t.
             super__Tuple_impl<0UL,_GenValidUsageXrHandleInfo_*,_std::default_delete<GenValidUsageXrHandleInfo>_>
             .super__Head_base<0UL,_GenValidUsageXrHandleInfo_*,_false>._M_head_impl = 0;
    *(long *)((long)local_30._M_t.
                    super__Tuple_impl<0UL,_GenValidUsageXrHandleInfo_*,_std::default_delete<GenValidUsageXrHandleInfo>_>
                    .super__Head_base<0UL,_GenValidUsageXrHandleInfo_*,_false>._M_head_impl + 8) = 0
    ;
    *(GenValidUsageXrInstanceInfo **)
     local_30._M_t.
     super__Tuple_impl<0UL,_GenValidUsageXrHandleInfo_*,_std::default_delete<GenValidUsageXrHandleInfo>_>
     .super__Head_base<0UL,_GenValidUsageXrHandleInfo_*,_false>._M_head_impl = pVar2.second;
    *(undefined4 *)
     ((long)local_30._M_t.
            super__Tuple_impl<0UL,_GenValidUsageXrHandleInfo_*,_std::default_delete<GenValidUsageXrHandleInfo>_>
            .super__Head_base<0UL,_GenValidUsageXrHandleInfo_*,_false>._M_head_impl + 8) = 2;
    *(XrSession *)
     ((long)local_30._M_t.
            super__Tuple_impl<0UL,_GenValidUsageXrHandleInfo_*,_std::default_delete<GenValidUsageXrHandleInfo>_>
            .super__Head_base<0UL,_GenValidUsageXrHandleInfo_*,_false>._M_head_impl + 0x10) =
         session;
    HandleInfoBase<XrWorldMeshDetectorML_T_*,_GenValidUsageXrHandleInfo>::insert
              (&g_worldmeshdetectorml_info.
                super_HandleInfoBase<XrWorldMeshDetectorML_T_*,_GenValidUsageXrHandleInfo>,*detector
               ,(unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>
                 *)&local_30);
    if ((_Tuple_impl<0UL,_GenValidUsageXrHandleInfo_*,_std::default_delete<GenValidUsageXrHandleInfo>_>
         )local_30._M_t.
          super__Tuple_impl<0UL,_GenValidUsageXrHandleInfo_*,_std::default_delete<GenValidUsageXrHandleInfo>_>
          .super__Head_base<0UL,_GenValidUsageXrHandleInfo_*,_false>._M_head_impl !=
        (GenValidUsageXrHandleInfo *)0x0) {
      operator_delete((void *)local_30._M_t.
                              super__Tuple_impl<0UL,_GenValidUsageXrHandleInfo_*,_std::default_delete<GenValidUsageXrHandleInfo>_>
                              .super__Head_base<0UL,_GenValidUsageXrHandleInfo_*,_false>.
                              _M_head_impl,0x18);
    }
    XVar1 = XR_SUCCESS;
  }
  return XVar1;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL GenValidUsageNextXrCreateWorldMeshDetectorML(
    XrSession session,
    const XrWorldMeshDetectorCreateInfoML* createInfo,
    XrWorldMeshDetectorML* detector) {
    XrResult result = XR_SUCCESS;
    try {
        auto info_with_instance = g_session_info.getWithInstanceInfo(session);
        GenValidUsageXrHandleInfo *gen_session_info = info_with_instance.first;
        (void)gen_session_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        result = gen_instance_info->dispatch_table->CreateWorldMeshDetectorML(session, createInfo, detector);
        if (XR_SUCCESS == result && nullptr != detector) {
            std::unique_ptr<GenValidUsageXrHandleInfo> handle_info(new GenValidUsageXrHandleInfo());
            handle_info->instance_info = gen_instance_info;
            handle_info->direct_parent_type = XR_OBJECT_TYPE_SESSION;
            handle_info->direct_parent_handle = MakeHandleGeneric(session);
            g_worldmeshdetectorml_info.insert(*detector, std::move(handle_info));
        }
    } catch (std::bad_alloc&) {
        result = XR_ERROR_OUT_OF_MEMORY;
    } catch (...) {
        result = XR_ERROR_VALIDATION_FAILURE;
    }
    return result;
}